

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_server.cpp
# Opt level: O0

int __thiscall zmq::plain_server_t::process_handshake_command(plain_server_t *this,msg_t *msg_)

{
  socket_base_t *psVar1;
  endpoint_uri_pair_t *peVar2;
  int *piVar3;
  char *pcVar4;
  endpoint_uri_pair_t *in_RSI;
  endpoint_uri_pair_t *in_RDI;
  char *errstr_1;
  char *errstr;
  int rc;
  msg_t *in_stack_000000d0;
  plain_server_t *in_stack_000000d8;
  undefined4 in_stack_ffffffffffffffd0;
  msg_t *in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe8;
  int iVar5;
  int err_;
  
  iVar5 = *(int *)&in_RDI[1].local;
  peVar2 = in_RSI;
  if (iVar5 == 0) {
    iVar5 = process_hello(in_stack_000000d8,in_stack_000000d0);
  }
  else if (iVar5 == 2) {
    iVar5 = process_initiate((plain_server_t *)(ulong)in_stack_ffffffffffffffe8,
                             in_stack_ffffffffffffffe0);
  }
  else {
    psVar1 = session_base_t::get_socket(*(session_base_t **)&in_RDI[0x14].local_type);
    err_ = (int)((ulong)psVar1 >> 0x20);
    peVar2 = session_base_t::get_endpoint((session_base_t *)0x31831c);
    socket_base_t::event_handshake_failed_protocol
              ((socket_base_t *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),in_RDI,err_);
    piVar3 = __errno_location();
    *piVar3 = 0x47;
    iVar5 = -1;
  }
  if (iVar5 == 0) {
    iVar5 = msg_t::close((msg_t *)in_RSI,(int)peVar2);
    if (iVar5 != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      peVar2 = (endpoint_uri_pair_t *)0x32b5b5;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_server.cpp"
              ,0x6a);
      fflush(_stderr);
      zmq_abort((char *)0x3183be);
    }
    iVar5 = msg_t::init((msg_t *)in_RSI,(EVP_PKEY_CTX *)peVar2);
    if (iVar5 != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_server.cpp"
              ,0x6c);
      fflush(_stderr);
      zmq_abort((char *)0x318432);
    }
  }
  return iVar5;
}

Assistant:

int zmq::plain_server_t::process_handshake_command (msg_t *msg_)
{
    int rc = 0;

    switch (state) {
        case waiting_for_hello:
            rc = process_hello (msg_);
            break;
        case waiting_for_initiate:
            rc = process_initiate (msg_);
            break;
        default:
            //  TODO see comment in curve_server_t::process_handshake_command
            session->get_socket ()->event_handshake_failed_protocol (
              session->get_endpoint (), ZMQ_PROTOCOL_ERROR_ZMTP_UNSPECIFIED);
            errno = EPROTO;
            rc = -1;
            break;
    }
    if (rc == 0) {
        rc = msg_->close ();
        errno_assert (rc == 0);
        rc = msg_->init ();
        errno_assert (rc == 0);
    }
    return rc;
}